

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<tcu::Vector<float,_2>_> __thiscall
vkt::shaderexecutor::Functions::Normalize<2>::doExpand
          (Normalize<2> *this,ExpandContext *param_1,ArgExprs *args)

{
  ExprP<tcu::Vector<float,_2>_> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Vector<float,_2>_> EVar1;
  ExprP<float> local_38;
  ArgExprs *args_local;
  ExpandContext *param_1_local;
  Normalize<2> *this_local;
  
  args_local = args;
  param_1_local = param_1;
  this_local = this;
  length<2>((Functions *)&local_38,in_RCX);
  shaderexecutor::operator/((shaderexecutor *)this,in_RCX,&local_38);
  ExprP<float>::~ExprP(&local_38);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_state = extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_2>_> *)this;
  return (ExprP<tcu::Vector<float,_2>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		return args.a / length<Size>(args.a);
	}